

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_catalog.cpp
# Opt level: O0

iterator __thiscall SystemCatalog::getType(SystemCatalog *this,string *typeName)

{
  bool bVar1;
  int iVar2;
  pointer ptVar3;
  _Self local_30;
  _Base_ptr local_28;
  string *local_20;
  string *typeName_local;
  SystemCatalog *this_local;
  iterator i;
  
  local_20 = typeName;
  typeName_local = (string *)this;
  std::_Rb_tree_const_iterator<type>::_Rb_tree_const_iterator
            ((_Rb_tree_const_iterator<type> *)&this_local);
  local_28 = (_Base_ptr)std::set<type,_std::less<type>,_std::allocator<type>_>::begin(&this->types);
  this_local = (SystemCatalog *)local_28;
  while( true ) {
    local_30._M_node =
         (_Base_ptr)std::set<type,_std::less<type>,_std::allocator<type>_>::end(&this->types);
    bVar1 = std::operator!=((_Self *)&this_local,&local_30);
    if (!bVar1) {
      return (iterator)(_Base_ptr)this_local;
    }
    ptVar3 = std::_Rb_tree_const_iterator<type>::operator->
                       ((_Rb_tree_const_iterator<type> *)&this_local);
    iVar2 = std::__cxx11::string::compare((string *)ptVar3);
    if (iVar2 == 0) break;
    std::_Rb_tree_const_iterator<type>::operator++((_Rb_tree_const_iterator<type> *)&this_local);
  }
  return (iterator)(_Base_ptr)this_local;
}

Assistant:

set<type>::iterator SystemCatalog::getType(string &typeName) {
    set<type>::iterator i;

    for (i = types.begin(); i != types.end(); ++i) {
        if (i->typeName.compare(typeName) == 0) { break; }
    }

    return i;
}